

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::qdxt1::create_selector_clusters
          (qdxt1 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  bool bVar1;
  uint y;
  uint uVar2;
  long lVar3;
  int iVar4;
  float *pfVar5;
  uint uVar6;
  dxt1_block *pdVar7;
  uint block_iter;
  ulong uVar8;
  weighted_selector_vec_array selector_vecs;
  color_quad_u8 second_color;
  color_quad_u8 first_color;
  vec16F sv;
  
  this->m_progress_start = this->m_progress_range;
  this->m_progress_range = 0x21;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::vector
            (&selector_vecs,this->m_num_blocks);
  for (uVar8 = 0; uVar8 < this->m_num_blocks; uVar8 = uVar8 + 1) {
    pdVar7 = this->m_pDst_elements + this->m_elements_per_block * (int)uVar8;
    pfVar5 = sv.m_s;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      for (iVar4 = 0; iVar4 != 8; iVar4 = iVar4 + 2) {
        *pfVar5 = (float)(byte)(&g_dxt1_to_linear)
                               [pdVar7->m_selectors[lVar3] >> ((byte)iVar4 & 0x1f) & 3];
        pfVar5 = pfVar5 + 1;
      }
    }
    dxt1_block::unpack_color((dxt1_block *)&first_color,*(uint16 *)pdVar7->m_low_color,true,0xff);
    dxt1_block::unpack_color((dxt1_block *)&second_color,*(uint16 *)pdVar7->m_high_color,true,0xff);
    uVar2 = crnlib::color::color_distance
                      ((this->m_params).m_perceptual,&first_color,&second_color,false);
    uVar6 = uVar2 / 2000;
    if (0x7ff < uVar6) {
      uVar6 = 0x800;
    }
    if (uVar2 < 2000) {
      uVar6 = 1;
    }
    vec<16U,_float>::operator=(&selector_vecs.m_p[uVar8].m_vec,&sv);
    selector_vecs.m_p[uVar8].m_weight = uVar6;
  }
  bVar1 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                    (&this->m_selector_clusterizer,&selector_vecs,max_selector_clusters,
                     selector_cluster_indices,generate_codebook_progress_callback,this);
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::~vector
            (&selector_vecs);
  return bVar1;
}

Assistant:

bool qdxt1::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices)
    {
        m_progress_start = m_progress_range;
        m_progress_range = 33;

        weighted_selector_vec_array selector_vecs(m_num_blocks);

        for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++)
        {
            dxt1_block& dxt1_block = get_block(block_iter);

            vec16F sv;
            float* pDst = &sv[0];

            for (uint y = 0; y < 4; y++)
            {
                for (uint x = 0; x < 4; x++)
                {
                    *pDst++ = g_dxt1_to_linear[dxt1_block.get_selector(x, y)];
                }
            }

            const color_quad_u8 first_color(dxt1_block::unpack_color((uint16)dxt1_block.get_low_color(), true));
            const color_quad_u8 second_color(dxt1_block::unpack_color((uint16)dxt1_block.get_high_color(), true));
            const uint dist = color::color_distance(m_params.m_perceptual, first_color, second_color, false);

            const uint cColorDistToWeight = 2000;
            const uint cMaxWeight = 2048;
            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

            selector_vecs[block_iter].m_vec = sv;
            selector_vecs[block_iter].m_weight = weight;
        }

        return m_selector_clusterizer.create_clusters(
            selector_vecs, max_selector_clusters, selector_cluster_indices, generate_codebook_progress_callback, this);
    }